

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O3

void mod2sparse_copycols(mod2sparse *m,mod2sparse *r,int *cols)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  mod2sparse *pmVar6;
  FILE *__stream;
  long lVar7;
  ulong uVar8;
  mod2entry *pmVar9;
  ulong uStack_60;
  
  pmVar6 = r;
  __stream = (FILE *)m;
  if (r->n_rows < m->n_rows) {
LAB_00121785:
    mod2sparse_copycols_cold_2();
    uVar2 = pmVar6->n_rows;
    uVar5 = 1;
    uStack_60 = 0x100000000;
    if ((((10 < (int)uVar2) && (uStack_60 = 0x200000000, 100 < uVar2)) &&
        (uStack_60 = 0x300000000, 1000 < uVar2)) && (uStack_60 = 0x400000000, 10000 < uVar2)) {
      uStack_60 = (ulong)(6 - (uVar2 < 0x186a1)) << 0x20;
    }
    uVar3 = pmVar6->n_cols;
    if (((10 < (int)uVar3) && (uVar5 = 2, 100 < uVar3)) &&
       ((uVar5 = 3, 1000 < uVar3 && (uVar5 = 4, 10000 < uVar3)))) {
      uVar5 = 6 - (uVar3 < 0x186a1);
    }
    if (0 < (int)uVar2) {
      uVar8 = 0;
      do {
        fprintf(__stream,"%*d:",uStack_60 >> 0x20,uVar8 & 0xffffffff);
        for (pmVar9 = pmVar6->rows[uVar8].right; -1 < pmVar9->row; pmVar9 = pmVar9->right) {
          fprintf(__stream," %*d",(ulong)uVar5,(ulong)(uint)pmVar9->col);
        }
        fputc(10,__stream);
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)pmVar6->n_rows);
    }
    return;
  }
  __stream = (FILE *)r;
  mod2sparse_clear(r);
  iVar4 = r->n_cols;
  if (0 < iVar4) {
    lVar7 = 0;
    do {
      iVar1 = cols[lVar7];
      if (((long)iVar1 < 0) || (m->n_cols <= iVar1)) {
        mod2sparse_copycols_cold_1();
        goto LAB_00121785;
      }
      pmVar9 = m->cols[iVar1].down;
      pmVar6 = (mod2sparse *)(ulong)(uint)pmVar9->row;
      if (-1 < pmVar9->row) {
        do {
          __stream = (FILE *)r;
          mod2sparse_insert(r,(int)pmVar6,(int)lVar7);
          pmVar9 = pmVar9->down;
          pmVar6 = (mod2sparse *)(ulong)(uint)pmVar9->row;
        } while (-1 < pmVar9->row);
        iVar4 = r->n_cols;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar4);
  }
  return;
}

Assistant:

void mod2sparse_copycols
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *cols		/* Indexes of columns to copy, from 0 */
)
{ 
  mod2entry *e;
  int j;

  if (mod2sparse_rows(m)>mod2sparse_rows(r))
  { fprintf(stderr,
      "mod2sparse_copycols: Destination matrix has fewer rows than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (j = 0; j<mod2sparse_cols(r); j++)
  { if (cols[j]<0 || cols[j]>=mod2sparse_cols(m))
    { fprintf(stderr,"mod2sparse_copycols: Column index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_col(m,cols[j]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,e->row,j);
      e = mod2sparse_next_in_col(e);
    }
  }
}